

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadInt16(ON_BinaryArchive *this,size_t count,ON__INT16 *p)

{
  ushort *puVar1;
  size_t count_00;
  size_t sVar2;
  size_t sVar3;
  
  count_00 = count * 2;
  sVar2 = Read(this,count_00,p);
  if ((count != 0 && sVar2 == count_00) && this->m_endian == big_endian) {
    sVar3 = 0;
    do {
      puVar1 = (ushort *)(p + sVar3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      sVar3 = sVar3 + 1;
    } while (count != sVar3);
  }
  return sVar2 == count_00;
}

Assistant:

bool
ON_BinaryArchive::ReadInt16( // Read an array of 16 bit integers
		size_t count,            // number of unsigned integers to read
		ON__INT16* p
		)
{
  bool rc = ReadByte( count<<1, p );
  if (rc && m_endian == ON::endian::big_endian)
  {
    // reverse byte order
		unsigned char* b= (unsigned char*) (p);
		unsigned char  c;
		while(count--) {
			c = b[0]; b[0] = b[1]; b[1] = c;
			b += 2;
		}
  }
  return rc;
}